

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test_output.cpp
# Opt level: O2

void test_input_modifiers(void)

{
  istream *piVar1;
  ostream *poVar2;
  int d;
  int c;
  int b;
  int a;
  
  std::operator<<((ostream *)&std::cout,"Enter four integers:\n");
  piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&a);
  *(uint *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x18) =
       *(uint *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x18) & 0xffffffb5 | 0x40;
  piVar1 = (istream *)std::istream::operator>>(piVar1,&b);
  *(uint *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x18) =
       *(uint *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  piVar1 = (istream *)std::istream::operator>>(piVar1,&c);
  std::istream::operator>>(piVar1,&d);
  *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,a);
  poVar2 = std::operator<<(poVar2,'\t');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,b);
  poVar2 = std::operator<<(poVar2,'\t');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,c);
  poVar2 = std::operator<<(poVar2,'\t');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,d);
  std::operator<<(poVar2,'\n');
  return;
}

Assistant:

void test_input_modifiers()
{
	std::cout << "Enter four integers:\n";
	int a, b, c, d;
	std::cin >> a >> std::oct >> b >> std::hex >> c >> d;
	std::cout << std::dec;
	// outputs 1234    668     4660    4660
	// because input to a was read as decimal
	// input to b was read as octal
	// input to c and d was read as hexadecimal
	std::cout << a << '\t' << b << '\t' << c << '\t' << d << '\n';
}